

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O2

RotationY<double> *
qclab::qgates::operator/
          (RotationY<double> *__return_storage_ptr__,RotationY<double> *lhs,RotationY<double> *rhs)

{
  int iVar1;
  double dVar2;
  int iVar3;
  
  iVar1 = (lhs->super_QRotationGate1<double>).super_QGate1<double>.qubit_;
  iVar3 = (*(rhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])(rhs);
  if (iVar1 == iVar3) {
    RotationY<double>::operator/=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.qubit_ =
         (lhs->super_QRotationGate1<double>).super_QGate1<double>.qubit_;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.field_0xc =
         (lhs->super_QRotationGate1<double>).super_QGate1<double>.field_0xc;
    dVar2 = (lhs->super_QRotationGate1<double>).rotation_.angle_.sin_;
    (__return_storage_ptr__->super_QRotationGate1<double>).rotation_.angle_.cos_ =
         (lhs->super_QRotationGate1<double>).rotation_.angle_.cos_;
    (__return_storage_ptr__->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar2;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.
    super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_004cc310;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xb9,"RotationY<T> qclab::qgates::operator/(RotationY<T>, const RotationY<T> &)");
}

Assistant:

RotationY< T > operator/( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }